

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::writeValue(BuiltStyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  byte bVar2;
  bool bVar3;
  size_t sVar4;
  Value *root;
  uint uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  LargestUInt value_00;
  LargestInt value_01;
  char *pcVar8;
  pointer key;
  Json *pJVar9;
  bool bVar10;
  double value_02;
  Members members;
  string local_70;
  string *local_50;
  Members local_48;
  
  bVar2 = (byte)*(ushort *)&value->field_0x8;
  if (7 < bVar2) {
    return;
  }
  iVar7 = 0x18ab34;
  uVar5 = (uint)((long)&switchD_0017d7af::switchdataD_0018ab34 +
                (long)(int)(&switchD_0017d7af::switchdataD_0018ab34)[bVar2]);
  switch(bVar2) {
  case 0:
    pushValue(this,&this->nullSymbol_);
    return;
  case 1:
    pJVar9 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_70,pJVar9,value_01);
    pushValue(this,&local_70);
    break;
  case 2:
    pJVar9 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_70,pJVar9,value_00);
    pushValue(this,&local_70);
    break;
  case 3:
    value_02 = Value::asDouble(value);
    (anonymous_namespace)::valueToString_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)(ulong)((this->field_0xd8 & 4) >> 2),value_02,
               SUB41(this->precision_,0),uVar5);
    pushValue(this,&local_70);
    break;
  case 4:
    bVar3 = bVar2 == 4;
    uVar5 = (uint)CONCAT71((int7)((ulong)((long)&switchD_0017d7af::switchdataD_0018ab34 +
                                         (long)(int)(&switchD_0017d7af::switchdataD_0018ab34)[bVar2]
                                         ) >> 8),bVar3);
    pJVar9 = (Json *)(value->value_).string_;
    bVar10 = pJVar9 != (Json *)0x0;
    if (bVar10 && bVar3) {
      if ((*(ushort *)&value->field_0x8 >> 8 & 1) == 0) {
        sVar4 = strlen((char *)pJVar9);
        iVar7 = (int)sVar4;
      }
      else {
        iVar7 = *(int *)pJVar9;
        pJVar9 = pJVar9 + 4;
      }
      iVar7 = iVar7 + (int)pJVar9;
    }
    if (bVar10 && bVar3) {
      valueToQuotedStringN_abi_cxx11_
                (&local_70,pJVar9,(char *)(ulong)(uint)(iVar7 - (int)pJVar9),uVar5);
      pushValue(this,&local_70);
      break;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    pushValue(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_0017db13;
  case 5:
    bVar3 = Value::asBool(value);
    pcVar8 = "false";
    if (bVar3) {
      pcVar8 = "true";
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar8,pcVar8 + ((ulong)bVar3 ^ 5));
    pushValue(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return;
    }
    goto LAB_0017db13;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    paVar6 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar6;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{}","");
      pushValue(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar6) goto LAB_0017d9ec;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
      writeWithIndent(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_50 = &this->indentString_;
      std::__cxx11::string::_M_append((char *)local_50,(ulong)(this->indentation_)._M_dataplus._M_p)
      ;
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        root = Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        valueToQuotedStringN_abi_cxx11_
                  (&local_70,(Json *)(key->_M_dataplus)._M_p,
                   (char *)(ulong)(uint)key->_M_string_length,(uint)paVar6);
        writeWithIndent(this,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_StreamWriter).sout_,(this->colonSymbol_)._M_dataplus._M_p,
                   (this->colonSymbol_)._M_string_length);
        writeValue(this,root);
        pbVar1 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        key = key + 1;
        if (key != local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>((this->super_StreamWriter).sout_,",",1)
          ;
        }
        writeCommentAfterValueOnSameLine(this,root);
      } while (key != pbVar1);
      std::__cxx11::string::resize
                ((ulong)local_50,
                 (char)(this->indentString_)._M_string_length -
                 (char)(this->indentation_)._M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"}","");
      writeWithIndent(this,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0017d9ec;
    }
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0017d9ec:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0017db13:
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeValue(Value const& value) {
  switch (value.type()) {
  case nullValue:
    pushValue(nullSymbol_);
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble(), useSpecialFloats_, precision_));
    break;
  case stringValue:
  {
    // Is NULL is possible for value.string_? No.
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        JSONCPP_STRING const& name = *it;
        Value const& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedStringN(name.data(), static_cast<unsigned>(name.length())));
        *sout_ << colonSymbol_;
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}